

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callFunctionTestSuite.cpp
# Opt level: O0

bool callMultipleGetSum(void)

{
  byte bVar1;
  int iVar2;
  bool bVar3;
  bool local_81;
  allocator<char> local_79;
  string local_78;
  int local_48;
  int local_44;
  int expectedSum;
  int i;
  undefined1 local_38 [3];
  bool testResult;
  int callsNumber;
  Test t;
  
  Test::Test((Test *)local_38);
  i = 10;
  expectedSum._3_1_ = 0;
  for (local_44 = 0; bVar1 = expectedSum._3_1_, local_44 < i; local_44 = local_44 + 1) {
    local_48 = local_44 + i;
    iVar2 = accessor::callFunction<accessor::FunctionWrapper<Test,int,int,int>,Test,int,int>
                      ((Test *)local_38,local_44,i);
    bVar3 = iVar2 == local_48;
    local_81 = false;
    if (bVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"getSum",&local_79);
      iVar2 = Test::getMethodVisitedCounter((Test *)local_38,&local_78);
      local_81 = local_44 < iVar2;
    }
    expectedSum._3_1_ = local_81;
    if (bVar3) {
      std::__cxx11::string::~string((string *)&local_78);
      std::allocator<char>::~allocator(&local_79);
    }
  }
  Test::~Test((Test *)local_38);
  return (bool)(bVar1 & 1);
}

Assistant:

bool callMultipleGetSum()
{
  Test t;
  int callsNumber = 10;
  bool testResult = false;

  for (int i = 0; i < callsNumber; ++i)
  {
    int expectedSum = i + callsNumber;
    testResult = (::accessor::callFunction<TestGetSum>(t, i, callsNumber) == expectedSum) &&
                 (t.getMethodVisitedCounter("getSum") > i);
  }

  return testResult;
}